

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void TestSemanticAnalysis(char *test_file_name)

{
  bool bVar1;
  ostream *poVar2;
  SymbolQueue *pSVar3;
  SymbolTableTree *pSVar4;
  PcodeGenerator *pPVar5;
  allocator local_ae1;
  string local_ae0;
  allocator local_ab9;
  string local_ab8;
  SymbolType local_a98;
  allocator local_a91;
  string local_a90;
  SymbolName local_a6c;
  undefined1 local_a68 [4];
  SymbolName name;
  Program program;
  Symbol symbol;
  undefined1 local_438 [8];
  LexicalAnalysis lexical_analysis;
  int ret;
  char *test_file_name_local;
  
  lexical_analysis._1052_4_ = 0;
  LexicalAnalysis::LexicalAnalysis((LexicalAnalysis *)local_438,test_file_name);
  bVar1 = LexicalAnalysis::CheckFile((LexicalAnalysis *)local_438);
  if (bVar1) {
    Symbol::Symbol((Symbol *)
                   &program.m_main_function.m_compound_statement.m_statement_list.m_statement.
                    m_statement_list_ptr);
    pSVar3 = (SymbolQueue *)operator_new(0x20);
    SymbolQueue::SymbolQueue(pSVar3);
    handle_symbol_queue = pSVar3;
    pSVar4 = (SymbolTableTree *)operator_new(0x60);
    SymbolTableTree::SymbolTableTree(pSVar4);
    symbol_table_tree = pSVar4;
    Program::Program((Program *)local_a68);
    pPVar5 = (PcodeGenerator *)operator_new(0x60);
    PcodeGenerator::PcodeGenerator(pPVar5,"pcode.txt");
    pcode_generator = pPVar5;
    do {
      lexical_analysis._1052_4_ =
           LexicalAnalysis::GetSym
                     ((LexicalAnalysis *)local_438,
                      (Symbol *)
                      &program.m_main_function.m_compound_statement.m_statement_list.m_statement.
                       m_statement_list_ptr);
      if (lexical_analysis._1052_4_ != 0) {
        poVar2 = std::operator<<((ostream *)&std::cerr,
                                 "lexical analysys error, please run TestLexicalAnalysis to check");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        goto LAB_0017acc7;
      }
      SymbolQueue::PushSymbol
                (handle_symbol_queue,
                 (Symbol *)
                 &program.m_main_function.m_compound_statement.m_statement_list.m_statement.
                  m_statement_list_ptr);
      local_a6c = Symbol::GetName((Symbol *)
                                  &program.m_main_function.m_compound_statement.m_statement_list.
                                   m_statement.m_statement_list_ptr);
    } while (local_a6c != EOF_SYM);
    poVar2 = std::operator<<((ostream *)&std::cout,"push over");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    Program::Parse((Program *)local_a68);
    pSVar4 = symbol_table_tree;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a90,"global",&local_a91);
    local_a98 = VOID;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_ab8,"end",&local_ab9);
    SymbolTableTree::InsertTable(pSVar4,&local_a90,&local_a98,&local_ab8);
    std::__cxx11::string::~string((string *)&local_ab8);
    std::allocator<char>::~allocator((allocator<char> *)&local_ab9);
    std::__cxx11::string::~string((string *)&local_a90);
    std::allocator<char>::~allocator((allocator<char> *)&local_a91);
    pSVar4 = symbol_table_tree;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_ae0,"global",&local_ae1);
    SymbolTableTree::SetCurrentTableName(pSVar4,&local_ae0);
    std::__cxx11::string::~string((string *)&local_ae0);
    std::allocator<char>::~allocator((allocator<char> *)&local_ae1);
    handle_correct_queue = handle_symbol_queue;
    SymbolQueue::Restart(handle_symbol_queue);
    Program::Action((Program *)local_a68);
    SymbolTableTree::PrintTree(symbol_table_tree);
LAB_0017acc7:
    pPVar5 = pcode_generator;
    if (pcode_generator != (PcodeGenerator *)0x0) {
      PcodeGenerator::~PcodeGenerator(pcode_generator);
      operator_delete(pPVar5);
    }
    pSVar4 = symbol_table_tree;
    if (symbol_table_tree != (SymbolTableTree *)0x0) {
      SymbolTableTree::~SymbolTableTree(symbol_table_tree);
      operator_delete(pSVar4);
    }
    pSVar3 = handle_symbol_queue;
    if (handle_symbol_queue != (SymbolQueue *)0x0) {
      SymbolQueue::~SymbolQueue(handle_symbol_queue);
      operator_delete(pSVar3);
    }
    Program::~Program((Program *)local_a68);
    Symbol::~Symbol((Symbol *)
                    &program.m_main_function.m_compound_statement.m_statement_list.m_statement.
                     m_statement_list_ptr);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"bad file");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  LexicalAnalysis::~LexicalAnalysis((LexicalAnalysis *)local_438);
  return;
}

Assistant:

void TestSemanticAnalysis(const char* test_file_name) {
    int ret = COMPILE_OK;
    LexicalAnalysis lexical_analysis(test_file_name);
    if (!lexical_analysis.CheckFile()) {
        std::cerr << "bad file" << endl;
        return;
    }
    Symbol symbol;
    handle_symbol_queue = new SymbolQueue;
    symbol_table_tree = new SymbolTableTree;
    Program program;
    pcode_generator = new PcodeGenerator("pcode.txt");
    while (true) {
        ret = lexical_analysis.GetSym(symbol);
        if (ret != COMPILE_OK) {
            std::cerr << "lexical analysys error, please run TestLexicalAnalysis to check" << endl;
            goto ERROR1;
        }
        handle_symbol_queue->PushSymbol(symbol);
        SymbolName name = symbol.GetName();
        if (name == EOF_SYM)
            break;
    }
    cout << "push over" << endl;
    program.Parse();
    symbol_table_tree->InsertTable(string("global"), VOID, string("end"));
    symbol_table_tree->SetCurrentTableName(string("global"));
    handle_correct_queue = handle_symbol_queue;
    handle_correct_queue->Restart();
    program.Action();
    symbol_table_tree->PrintTree();
ERROR1:
    delete(pcode_generator);
    delete(symbol_table_tree);
    delete(handle_symbol_queue);
}